

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

int __thiscall
testing::internal::FunctionMocker<int_()>::PerformAction
          (FunctionMocker<int_()> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  undefined1 local_50 [8];
  Action<int_()> action;
  string *call_description_local;
  ArgumentTuple *args_local;
  void *untyped_action_local;
  FunctionMocker<int_()> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)call_description;
  if (untyped_action == (void *)0x0) {
    this_local._4_4_ = PerformDefaultAction(this,args,call_description);
  }
  else {
    Action<int_()>::Action((Action<int_()> *)local_50,(Action<int_()> *)untyped_action);
    this_local._4_4_ = Action<int_()>::Perform((Action<int_()> *)local_50);
    Action<int_()>::~Action((Action<int_()> *)local_50);
  }
  return this_local._4_4_;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }